

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O1

LoopHandle __thiscall
gmlc::networking::AsioContextManager::startContextLoop(AsioContextManager *this)

{
  long *plVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  work *pwVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  pointer __p;
  long *plVar9;
  _func_int **pp_Var10;
  pointer *__ptr;
  long in_RSI;
  bool bVar11;
  thread contextThread;
  unique_lock<std::mutex> nullLock;
  packaged_task<void_()> contextTask;
  packaged_task<void_()> local_98 [2];
  undefined1 local_78 [16];
  unique_lock<std::mutex> local_68;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  shared_future<void> local_48;
  shared_future<void> local_38;
  
  LOCK();
  *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x18) + 1;
  UNLOCK();
  std::__shared_ptr<gmlc::networking::AsioContextManager,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gmlc::networking::AsioContextManager,void>
            ((__shared_ptr<gmlc::networking::AsioContextManager,(__gnu_cxx::_Lock_policy)2> *)
             &local_58,
             (__weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 8));
  LOCK();
  bVar11 = *(int *)(in_RSI + 0x54) == 0;
  if (bVar11) {
    *(int *)(in_RSI + 0x54) = 1;
  }
  UNLOCK();
  if (bVar11) {
    local_78._0_8_ = local_58;
    local_78._8_8_ = p_Stack_50;
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_50->_M_use_count = p_Stack_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_50->_M_use_count = p_Stack_50->_M_use_count + 1;
      }
    }
    std::
    __create_task_state<void(),gmlc::networking::AsioContextManager::startContextLoop()::__0,std::allocator<int>>
              ((anon_class_16_1_ba1d6e4e_for__M_fn *)&local_68,(allocator<int> *)local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    local_78._0_8_ = in_RSI + 0x58;
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
    local_78[8] = true;
    lVar4 = *(long *)(in_RSI + 0x40);
    plVar9 = (long *)operator_new(8);
    lVar4 = *(long *)(lVar4 + 8);
    *plVar9 = lVar4;
    LOCK();
    plVar1 = (long *)(lVar4 + 0xd8);
    *plVar1 = *plVar1 + 1;
    UNLOCK();
    local_98[0]._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    pwVar5 = *(work **)(in_RSI + 0x48);
    *(long **)(in_RSI + 0x48) = plVar9;
    if (pwVar5 != (work *)0x0) {
      std::default_delete<asio::io_context::work>::operator()
                ((default_delete<asio::io_context::work> *)(in_RSI + 0x48),pwVar5);
    }
    if (local_98[0]._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::default_delete<asio::io_context::work>::operator()
                ((default_delete<asio::io_context::work> *)local_98,
                 (work *)local_98[0]._M_state.
                         super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    std::packaged_task<void_()>::get_future(local_98);
    _Var8._M_pi = local_98[0]._M_state.
                  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar7 = local_98[0]._M_state.
             super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_98[0]._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_98[0]._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x90);
    *(element_type **)(in_RSI + 0x88) = peVar7;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x90) = _Var8._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    if (local_98[0]._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_98[0]._M_state.
                 super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_38.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(in_RSI + 0x88);
    local_38.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x90);
    if (local_38.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_38.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_38.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_38.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_38.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    storeFuture(&local_38);
    if (local_38.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_38.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_78);
    std::thread::thread<std::packaged_task<void()>,,void>
              ((thread *)local_98,(packaged_task<void_()> *)&local_68);
    std::thread::detach();
    if (local_98[0]._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
LAB_00413b6a:
      std::terminate();
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
    std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)&local_68);
  }
  else {
    local_68._M_device = (mutex_type *)(in_RSI + 0x58);
    local_68._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_68);
    local_68._M_owns = true;
    lVar4 = *(long *)(*(long *)(in_RSI + 0x40) + 8);
    cVar2 = *(char *)(lVar4 + 0x60);
    if (cVar2 == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)(lVar4 + 0x38));
    }
    cVar3 = *(char *)(lVar4 + 0xf0);
    if (cVar2 != '\0') {
      pthread_mutex_unlock((pthread_mutex_t *)(lVar4 + 0x38));
    }
    if (cVar3 != '\0') {
      if (*(long *)(in_RSI + 0x88) != 0) {
        std::__basic_future<void>::_M_get_result((__basic_future<void> *)(in_RSI + 0x88));
      }
      std::unique_lock<std::mutex>::unlock(&local_68);
      LOCK();
      bVar11 = *(int *)(in_RSI + 0x54) == 0;
      if (bVar11) {
        *(int *)(in_RSI + 0x54) = 1;
      }
      UNLOCK();
      if (bVar11) {
        local_98[0]._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_58;
        local_98[0]._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_50;
        if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_50->_M_use_count = p_Stack_50->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_50->_M_use_count = p_Stack_50->_M_use_count + 1;
          }
        }
        std::
        __create_task_state<void(),gmlc::networking::AsioContextManager::startContextLoop()::__1,std::allocator<int>>
                  ((anon_class_16_1_ba1d6e4e_for__M_fn *)local_78,(allocator<int> *)local_98);
        if (local_98[0]._M_state.
            super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_98[0]._M_state.
                     super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::unique_lock<std::mutex>::lock(&local_68);
        lVar4 = *(long *)(in_RSI + 0x40);
        plVar9 = (long *)operator_new(8);
        lVar4 = *(long *)(lVar4 + 8);
        *plVar9 = lVar4;
        LOCK();
        plVar1 = (long *)(lVar4 + 0xd8);
        *plVar1 = *plVar1 + 1;
        UNLOCK();
        local_98[0]._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        pwVar5 = *(work **)(in_RSI + 0x48);
        *(long **)(in_RSI + 0x48) = plVar9;
        if (pwVar5 != (work *)0x0) {
          std::default_delete<asio::io_context::work>::operator()
                    ((default_delete<asio::io_context::work> *)(in_RSI + 0x48),pwVar5);
        }
        if (local_98[0]._M_state.
            super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          std::default_delete<asio::io_context::work>::operator()
                    ((default_delete<asio::io_context::work> *)local_98,
                     (work *)local_98[0]._M_state.
                             super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        }
        std::packaged_task<void_()>::get_future(local_98);
        _Var8._M_pi = local_98[0]._M_state.
                      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        peVar7 = local_98[0]._M_state.
                 super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_98[0]._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_98[0]._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x90);
        *(element_type **)(in_RSI + 0x88) = peVar7;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x90) = _Var8._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        if (local_98[0]._M_state.
            super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_98[0]._M_state.
                     super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_48.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(in_RSI + 0x88);
        local_48.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x90);
        if (local_48.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_48.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_48.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_48.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_48.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        storeFuture(&local_48);
        if (local_48.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_48.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::unique_lock<std::mutex>::unlock(&local_68);
        std::thread::thread<std::packaged_task<void()>,,void>
                  ((thread *)local_98,(packaged_task<void_()> *)local_78);
        std::thread::detach();
        if (local_98[0]._M_state.
            super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) goto LAB_00413b6a;
        std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)local_78);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_68);
  }
  pp_Var10 = (_func_int **)operator_new(0x10);
  *pp_Var10 = (_func_int *)local_58;
  pp_Var10[1] = (_func_int *)p_Stack_50;
  this->_vptr_AsioContextManager = pp_Var10;
  return (__uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
          )(__uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
            )this;
}

Assistant:

AsioContextManager::LoopHandle AsioContextManager::startContextLoop()
{
    ++runCounter;  // atomic
    auto ptr = shared_from_this();
    loop_mode exp = loop_mode::stopped;
    if (running.compare_exchange_strong(exp, loop_mode::starting)) {
        std::packaged_task<void()> contextTask(
            [ptr]() { contextProcessingLoop(ptr); });
        //   std::cout << "run Context loop " << runCounter << "\n";
        std::unique_lock<std::mutex> nullLock(runningLoopLock);

        nullwork = std::make_unique<asio::io_context::work>(getBaseContext());
        loopRet = contextTask.get_future().share();
        AsioContextManager::storeFuture(loopRet);
        nullLock.unlock();
        std::thread contextThread(std::move(contextTask));
        contextThread.detach();
        //  std::cout << "starting context loop thread " << runCounter << "\n";
    } else {
        std::unique_lock<std::mutex> nullLock(runningLoopLock);
        if (getBaseContext().stopped()) {
            // std::cout << "run Context loop already stopped" << runCounter <<
            // "\n";
            if (loopRet.valid()) {
                loopRet.get();
            }
            nullLock.unlock();
            exp = loop_mode::stopped;
            if (running.compare_exchange_strong(exp, loop_mode::starting)) {
                std::packaged_task<void()> contextTask(
                    [ptr]() { contextProcessingLoop(ptr); });
                nullLock.lock();
                nullwork =
                    std::make_unique<asio::io_context::work>(getBaseContext());
                loopRet = contextTask.get_future();
                AsioContextManager::storeFuture(loopRet);
                nullLock.unlock();
                std::thread contextThread(std::move(contextTask));
                contextThread.detach();
            }
        }
    }
    return std::make_unique<Servicer>(std::move(ptr));
}